

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Entity_Damage_Status_PDU *this)

{
  pointer pKVar1;
  KString *pKVar2;
  ostream *poVar3;
  ulong uVar4;
  ushort uVar5;
  pointer pKVar6;
  KStringStream ss;
  char local_3a9;
  KString *local_3a8;
  KString local_3a0;
  long *local_380;
  long local_378;
  long local_370 [2];
  KString local_360;
  ostream *local_340;
  long local_338;
  long local_330 [14];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_360._M_dataplus._M_p,local_360._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-Entity Damage Status PDU-\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Damaged Entity ID:\n",0x13);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_3a0,&this->m_DmgEnt);
  local_3a8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
  local_3a9 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,&local_3a9,1);
  if (local_3a0._M_string_length != 0) {
    uVar5 = 1;
    uVar4 = 0;
    do {
      local_3a9 = local_3a0._M_dataplus._M_p[uVar4];
      if ((local_3a0._M_string_length - 1 == uVar4) || (local_3a9 != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,&local_3a9,1);
      }
      else {
        local_3a9 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,&local_3a9,1);
        local_3a9 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,&local_3a9,1);
      }
      uVar4 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar4 < local_3a0._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_380,local_378);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Number Of DD Records: ",0x16);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nDE Records:\n",0xd);
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  pKVar6 = (this->m_vDdRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar1 = (this->m_vDdRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar6 != pKVar1) {
    do {
      (*(pKVar6->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_340);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_340,local_338);
      if (local_340 != (ostream *)local_330) {
        operator_delete(local_340,local_330[0] + 1);
      }
      pKVar6 = pKVar6 + 1;
    } while (pKVar6 != pKVar1);
  }
  pKVar2 = local_3a8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString Entity_Damage_Status_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Entity Damage Status PDU-\n"
       << "Damaged Entity ID:\n"
       << IndentString( m_DmgEnt.GetAsString(), 1 )
       << "Number Of DD Records: " << m_ui16NumDmgDescRecs
       << "\nDE Records:\n";

    vector<StdVarPtr>::const_iterator citr = m_vDdRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vDdRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}